

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O3

int GetLatestDataMT(MT *pMT,MTDATA *pMTData)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint offset;
  uint uVar4;
  long lVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ulong extraout_XMM0_Qb;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  uchar databuf [2048];
  double dStack_890;
  double local_878;
  int local_84c;
  double local_848;
  double local_838;
  ulong uStack_830;
  uint local_828;
  ushort uStack_824;
  uchar auStack_822 [2050];
  
  if (pMT->bLegacyMode != 0) {
    memset(&local_828,0,0x800);
    local_84c = 0;
    iVar2 = GetLatestMTMessageMT(pMT,0xff,0x32,(uchar *)&local_828,0x800,&local_84c);
    iVar3 = 1;
    if (iVar2 == 0) {
      memset(pMTData,0,0x130);
      uVar4 = pMT->OutputMode;
      uVar6 = (int)(uVar4 << 0x11) >> 0x1f & 0x14;
      offset = uVar6 + 0x2c;
      if ((uVar4 >> 0xc & 1) == 0) {
        offset = uVar6;
      }
      if ((uVar4 & 1) != 0) {
        offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,offset,&pMTData->temp);
        uVar4 = pMT->OutputMode;
      }
      if ((uVar4 & 2) != 0) {
        uVar4 = pMT->OutputSettings;
        if ((uVar4 & 0x10) == 0) {
          iVar2 = ConvertToDoubleMT(uVar4,(uchar *)&local_828,offset,&pMTData->accX);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->accY);
          offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->accZ);
          uVar4 = pMT->OutputSettings;
        }
        if ((uVar4 & 0x20) == 0) {
          iVar2 = ConvertToDoubleMT(uVar4,(uchar *)&local_828,offset,&pMTData->gyrX);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->gyrY);
          offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->gyrZ);
          uVar4 = pMT->OutputSettings;
        }
        if ((uVar4 & 0x40) == 0) {
          iVar2 = ConvertToDoubleMT(uVar4,(uchar *)&local_828,offset,&pMTData->magX);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->magY);
          offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->magZ);
        }
      }
      uVar4 = pMT->OutputMode;
      if ((uVar4 & 4) != 0) {
        uVar4 = pMT->OutputSettings;
        if ((uVar4 & 0xc) == 8) {
          iVar2 = ConvertToDoubleMT(uVar4,(uchar *)&local_828,offset,&pMTData->a);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->b);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->c);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->d);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->e);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->f);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->g);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->h);
          offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->i);
          dVar9 = atan2(pMTData->f,pMTData->i);
          dVar10 = pMTData->c;
          dVar7 = -1.0;
          if ((-1.0 <= dVar10) && (dVar7 = 1.0, dVar10 <= 1.0)) {
            dVar7 = dVar10;
          }
          dVar10 = asin(dVar7);
          local_878 = atan2(pMTData->b,pMTData->a);
          auVar15._0_8_ = dVar9 * 180.0;
          auVar15._8_8_ = dVar10 * -180.0;
          auVar13 = divpd(auVar15,_DAT_001cc5a0);
          pMTData->roll = (double)auVar13._0_8_;
          pMTData->pitch = (double)auVar13._8_8_;
          pMTData->yaw = (local_878 * 180.0) / 3.141592653589793;
          auVar13._8_8_ = -dVar10;
          auVar13._0_8_ = dVar9;
        }
        else if ((uVar4 & 0xc) == 4) {
          iVar2 = ConvertToDoubleMT(uVar4,(uchar *)&local_828,offset,&pMTData->roll);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->pitch);
          offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->yaw);
          auVar12._0_8_ = pMTData->roll * 3.141592653589793;
          auVar12._8_8_ = pMTData->pitch * 3.141592653589793;
          auVar13 = divpd(auVar12,_DAT_001cc5b0);
          local_878 = (pMTData->yaw * 3.141592653589793) / 180.0;
        }
        else {
          iVar2 = ConvertToDoubleMT(uVar4,(uchar *)&local_828,offset,&pMTData->q0);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->q1);
          iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->q2);
          offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->q3);
          dVar10 = pMTData->q0;
          dVar7 = pMTData->q1;
          dVar9 = pMTData->q2;
          dVar1 = pMTData->q3;
          dVar11 = dVar10 + dVar10;
          dVar14 = dVar10 * dVar10 + dVar10 * dVar10;
          dVar8 = atan2((dVar9 + dVar9) * dVar1 + dVar11 * dVar7,
                        dVar1 * dVar1 + dVar1 * dVar1 + dVar14 + -1.0);
          dVar17 = (dVar7 + dVar7) * dVar1 - dVar9 * dVar11;
          dVar10 = -1.0;
          if ((-1.0 <= dVar17) && (dVar10 = 1.0, dVar17 <= 1.0)) {
            dVar10 = dVar17;
          }
          local_848 = asin(dVar10);
          local_838 = -local_848;
          uStack_830 = extraout_XMM0_Qb ^ 0x8000000000000000;
          local_878 = atan2((dVar7 + dVar7) * dVar9 + dVar11 * dVar1,
                            dVar14 + dVar7 * dVar7 + dVar7 * dVar7 + -1.0);
          auVar16._0_8_ = dVar8 * 180.0;
          auVar16._8_8_ = local_848 * -180.0;
          auVar13 = divpd(auVar16,_DAT_001cc5a0);
          pMTData->roll = (double)auVar13._0_8_;
          pMTData->pitch = (double)auVar13._8_8_;
          pMTData->yaw = (local_878 * 180.0) / 3.141592653589793;
          auVar13._8_8_ = local_838;
          auVar13._0_8_ = dVar8;
        }
        dVar10 = pMT->rollorientation;
        dVar7 = pMT->rollp1;
        dVar9 = cos(pMT->rollp2 + auVar13._0_8_);
        dVar10 = fmod(dVar9 * dVar7 + dVar10 + auVar13._0_8_,6.283185307179586);
        dVar10 = fmod(dVar10 + 9.42477796076938,6.283185307179586);
        pMTData->Roll = dVar10 + -3.141592653589793;
        dStack_890 = auVar13._8_8_;
        dVar10 = pMT->pitchorientation;
        dVar7 = pMT->pitchp1;
        dVar9 = cos(dStack_890 + pMT->pitchp2);
        dVar10 = fmod(dVar9 * dVar7 + dVar10 + dStack_890,6.283185307179586);
        dVar10 = fmod(dVar10 + 9.42477796076938,6.283185307179586);
        pMTData->Pitch = dVar10 + -3.141592653589793;
        dVar10 = pMT->yaworientation;
        dVar7 = pMT->yawp1;
        dVar9 = cos(local_878 + pMT->yawp2);
        dVar10 = fmod(dVar9 * dVar7 + dVar10 + local_878,6.283185307179586);
        dVar10 = fmod(dVar10 + 9.42477796076938,6.283185307179586);
        pMTData->Yaw = dVar10 + -3.141592653589793;
        uVar4 = pMT->OutputMode;
      }
      if ((uVar4 & 8) != 0) {
        uVar6 = pMT->OutputSettings;
        if ((uVar6 >> 10 & 1) == 0) {
          pMTData->Ain_1 =
               *(ushort *)((long)&local_828 + (long)(int)offset) << 8 |
               *(ushort *)((long)&local_828 + (long)(int)offset) >> 8;
          offset = offset + 2;
        }
        if ((uVar6 >> 0xb & 1) == 0) {
          pMTData->Ain_2 =
               *(ushort *)((long)&local_828 + (long)(int)offset) << 8 |
               *(ushort *)((long)&local_828 + (long)(int)offset) >> 8;
          offset = offset + 2;
        }
      }
      if ((uVar4 & 0x10) != 0) {
        iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,offset,&pMTData->Lat);
        iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->Long);
        offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->Alt);
        uVar4 = pMT->OutputMode;
      }
      if ((uVar4 & 0x20) != 0) {
        iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,offset,&pMTData->Vel_X);
        iVar2 = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->Vel_Y);
        offset = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&local_828,iVar2,&pMTData->Vel_Z);
        uVar4 = pMT->OutputMode;
      }
      if ((uVar4 >> 0xb & 1) != 0) {
        pMTData->Status = *(uchar *)((long)&local_828 + (long)(int)offset);
        offset = offset + 1;
      }
      uVar4 = pMT->OutputSettings;
      if ((uVar4 & 1) != 0) {
        pMTData->TS = *(ushort *)((long)&local_828 + (long)(int)offset) << 8 |
                      *(ushort *)((long)&local_828 + (long)(int)offset) >> 8;
        offset = offset + 2;
      }
      if ((uVar4 & 2) != 0) {
        lVar5 = (long)(int)offset;
        uVar4 = *(uint *)((long)&local_828 + lVar5);
        (pMTData->UTCTime).Nanoseconds =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        (pMTData->UTCTime).Year =
             *(ushort *)((long)&uStack_824 + lVar5) << 8 |
             *(ushort *)((long)&uStack_824 + lVar5) >> 8;
        (pMTData->UTCTime).Month = auStack_822[lVar5];
        (pMTData->UTCTime).Day = auStack_822[lVar5 + 1];
        (pMTData->UTCTime).Hour = auStack_822[lVar5 + 2];
        (pMTData->UTCTime).Minute = auStack_822[lVar5 + 3];
        (pMTData->UTCTime).Seconds = auStack_822[lVar5 + 4];
        (pMTData->UTCTime).Valid = auStack_822[lVar5 + 5];
      }
      memcpy(&pMT->LastMTData,pMTData,0x130);
      iVar3 = 0;
    }
    return iVar3;
  }
  iVar2 = GetLatestData2MT(pMT,pMTData);
  return iVar2;
}

Assistant:

inline int GetLatestDataMT(MT* pMT, MTDATA* pMTData)
{
	unsigned char databuf[MAX_NB_BYTES_MT];
	int nbdatabytes = 0;
	int offset = 0;
	uShort_MT us;
	uInt_MT ul;
	double roll = 0, pitch = 0, yaw = 0;

	// Warning : coordinate system might not be the same between legacy and normal modes!

	if (!pMT->bLegacyMode) return GetLatestData2MT(pMT, pMTData);

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, MTDATA_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		return EXIT_FAILURE;	
	}

	// Analyze data.

	memset(pMTData, 0, sizeof(MTDATA));

	if (pMT->OutputMode & RAW_BIT)
	{
		// Un-calibrated RAW inertial data output mode.
		offset += 20;
	}

	if (pMT->OutputMode & GPS_PVT_BIT)
	{
		// GPS PVT data output mode.
		offset += 44;
	}

	if (pMT->OutputMode & TEMPERATURE_BIT)
	{
		// Temperature data output mode.
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->temp);
	}

	if (pMT->OutputMode & CALIBRATED_BIT)
	{
		// Calibrated data output mode.
		if ((pMT->OutputSettings & ACCELERATION) == 0)
		{
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->accX);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->accY);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->accZ);
		}
		if ((pMT->OutputSettings & RATE_OF_TURN) == 0)
		{
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->gyrX);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->gyrY);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->gyrZ);
		}
		if ((pMT->OutputSettings & MAGNETOMETER) == 0)
		{
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->magX);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->magY);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->magZ);
		}
	}

	if (pMT->OutputMode & ORIENTATION_BIT)
	{
		switch (pMT->OutputSettings & ORIENTATION_MODE_MASK)
		{
		case EULER_ANGLES:
			// Orientation data output mode - Euler angles.
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->roll);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->pitch);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->yaw);
			roll = pMTData->roll*M_PI/180.0;
			pitch = pMTData->pitch*M_PI/180.0;
			yaw = pMTData->yaw*M_PI/180.0;
			break;
		case MATRIX:
			// Orientation data output mode - Matrix.
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->a);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->b);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->c);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->d);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->e);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->f);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->g);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->h);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->i);
			roll = atan2(pMTData->f,pMTData->i);
			pitch = -asin(constrain(pMTData->c, -1, 1)); // Attempt to avoid potential NAN...
			yaw = atan2(pMTData->b,pMTData->a);
			
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;
			break;
		default:
			// Orientation data output mode - Quaternion.
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q0);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q1);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q2);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q3);
			quaternion2euler(pMTData->q0, pMTData->q1, pMTData->q2, pMTData->q3, &roll, &pitch, &yaw);
			
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;
			break;
		}

		// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
		pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
		pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
		pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
	}

	if (pMT->OutputMode & AUXILIARY_BIT)
	{
		// Auxiliary data output mode.
		if ((pMT->OutputSettings & ANALOG_1) == 0)
		{
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_1 = us.v;
			offset += 2;
		}
		if ((pMT->OutputSettings & ANALOG_2) == 0)
		{
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_2 = us.v;
			offset += 2;
		}
	}

	if (pMT->OutputMode & POSITION_BIT)
	{
		// Position data output mode - LLA.
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Lat);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Long);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Alt);
	}

	if (pMT->OutputMode & VELOCITY_BIT)
	{
		// Velocity data output mode - VelXYZ.
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Vel_X);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Vel_Y);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Vel_Z);
	}

	if (pMT->OutputMode & STATUS_BIT)
	{
		// Status (1 byte).
		pMTData->Status = databuf[offset];
		offset += 1;
	}

	if (pMT->OutputSettings & SAMPLE_COUNTER)
	{
		// Sample counter (2 bytes).
		us.c[0] = databuf[1+offset];
		us.c[1] = databuf[0+offset];
		pMTData->TS = us.v;
		offset += 2;
	}

	if (pMT->OutputSettings & UTC_TIME)
	{
		// UTC Time (12 bytes).
		ul.c[0] = databuf[3+offset];
		ul.c[1] = databuf[2+offset];
		ul.c[2] = databuf[1+offset];
		ul.c[3] = databuf[0+offset];
		pMTData->UTCTime.Nanoseconds = ul.v;
		offset += 4;
		us.c[0] = databuf[1+offset];
		us.c[1] = databuf[0+offset];
		pMTData->UTCTime.Year = us.v;
		offset += 2;
		pMTData->UTCTime.Month = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Day = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Hour = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Minute = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Seconds = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Valid = databuf[offset];
		offset += 1;
	}

	pMT->LastMTData = *pMTData;

	return EXIT_SUCCESS;
}